

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OrderedTestTest.cpp
# Opt level: O0

void __thiscall
TEST_TestOrderedTest_MultipleOrderedTests2_Test::testBody
          (TEST_TestOrderedTest_MultipleOrderedTests2_Test *this)

{
  int iVar1;
  UtestShell *pUVar2;
  UtestShell *pUVar3;
  TestTerminator *pTVar4;
  undefined4 extraout_var;
  TEST_TestOrderedTest_MultipleOrderedTests2_Test *this_local;
  
  TEST_GROUP_CppUTestGroupTestOrderedTest::InstallOrderedTest
            (&this->super_TEST_GROUP_CppUTestGroupTestOrderedTest,
             &(this->super_TEST_GROUP_CppUTestGroupTestOrderedTest).orderedTest,3);
  TEST_GROUP_CppUTestGroupTestOrderedTest::InstallOrderedTest
            (&this->super_TEST_GROUP_CppUTestGroupTestOrderedTest,
             &(this->super_TEST_GROUP_CppUTestGroupTestOrderedTest).orderedTest2,1);
  TEST_GROUP_CppUTestGroupTestOrderedTest::InstallOrderedTest
            (&this->super_TEST_GROUP_CppUTestGroupTestOrderedTest,
             &(this->super_TEST_GROUP_CppUTestGroupTestOrderedTest).orderedTest3,2);
  pUVar2 = UtestShell::getCurrent();
  pUVar3 = TEST_GROUP_CppUTestGroupTestOrderedTest::firstTest
                     (&this->super_TEST_GROUP_CppUTestGroupTestOrderedTest);
  pTVar4 = UtestShell::getCurrentTestTerminator();
  (*pUVar2->_vptr_UtestShell[8])
            (pUVar2,(ulong)((OrderedTestShell *)pUVar3 ==
                           &(this->super_TEST_GROUP_CppUTestGroupTestOrderedTest).orderedTest2),
             "CHECK","firstTest() == &orderedTest2",0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/OrderedTestTest.cpp"
             ,0x90,pTVar4);
  pUVar2 = UtestShell::getCurrent();
  pUVar3 = TEST_GROUP_CppUTestGroupTestOrderedTest::secondTest
                     (&this->super_TEST_GROUP_CppUTestGroupTestOrderedTest);
  pTVar4 = UtestShell::getCurrentTestTerminator();
  (*pUVar2->_vptr_UtestShell[8])
            (pUVar2,(ulong)((OrderedTestShell *)pUVar3 ==
                           &(this->super_TEST_GROUP_CppUTestGroupTestOrderedTest).orderedTest3),
             "CHECK","secondTest() == &orderedTest3",0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/OrderedTestTest.cpp"
             ,0x91,pTVar4);
  pUVar2 = UtestShell::getCurrent();
  pUVar3 = TEST_GROUP_CppUTestGroupTestOrderedTest::secondTest
                     (&this->super_TEST_GROUP_CppUTestGroupTestOrderedTest);
  iVar1 = (*pUVar3->_vptr_UtestShell[3])();
  pTVar4 = UtestShell::getCurrentTestTerminator();
  (*pUVar2->_vptr_UtestShell[8])
            (pUVar2,(ulong)((OrderedTestShell *)CONCAT44(extraout_var,iVar1) ==
                           &(this->super_TEST_GROUP_CppUTestGroupTestOrderedTest).orderedTest),
             "CHECK","secondTest()->getNext() == &orderedTest",0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/OrderedTestTest.cpp"
             ,0x92,pTVar4);
  return;
}

Assistant:

TEST(TestOrderedTest, MultipleOrderedTests2)
{
    InstallOrderedTest(orderedTest, 3);
    InstallOrderedTest(orderedTest2, 1);
    InstallOrderedTest(orderedTest3, 2);

    CHECK(firstTest() == &orderedTest2);
    CHECK(secondTest() == &orderedTest3);
    CHECK(secondTest()->getNext() == &orderedTest);

}